

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::handleProtectLicense
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  SyntaxNode *pSVar1;
  int iVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  size_t sVar4;
  Diagnostic *pDVar5;
  char *__s1;
  byte *pbVar6;
  ulong uVar7;
  size_type __rlen;
  long lVar8;
  string_view sVar9;
  SourceRange SVar10;
  string_view arg;
  Token local_48;
  PragmaExpressionSyntax *local_38;
  
  local_48.info = keyword.info;
  local_48._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    SVar10 = Token::range(&local_48);
  }
  else {
    if (((args->super_SyntaxNode).kind == ParenPragmaExpression) &&
       (pSVar1 = args[3].super_SyntaxNode.previewNode, pSVar1 != (SyntaxNode *)0x0)) {
      pbVar6 = (byte *)((long)&pSVar1->kind + 1);
      if (pbVar6 < (byte *)0x2) {
        return;
      }
      uVar7 = (ulong)pbVar6 >> 1;
      lVar8 = 0;
      local_38 = args;
      do {
        ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(local_38[3].super_SyntaxNode.parent)->kind + lVar8));
        pSVar1 = *ppSVar3;
        if (pSVar1->kind == NameValuePragmaExpression) {
          sVar9 = Token::valueText((Token *)(pSVar1 + 1));
          __s1 = sVar9._M_str;
          sVar4 = sVar9._M_len;
          if (((((sVar4 == 7) && (iVar2 = bcmp(__s1,"library",7), iVar2 == 0)) ||
               ((sVar4 == 5 && (iVar2 = bcmp(__s1,"entry",5), iVar2 == 0)))) ||
              ((sVar4 == 7 && (iVar2 = bcmp(__s1,"feature",7), iVar2 == 0)))) ||
             ((sVar4 == 4 && (iVar2 = bcmp(__s1,"exit",4), iVar2 == 0)))) {
            pSVar1 = pSVar1[2].parent;
            if ((pSVar1->kind != SimplePragmaExpression) ||
               ((short)pSVar1[1].kind != AcceptOnPropertyExpr)) {
              SVar10 = slang::syntax::SyntaxNode::sourceRange(pSVar1);
              pDVar5 = addDiag(this,(DiagCode)0x1f0004,SVar10);
              goto LAB_001ce1c1;
            }
          }
          else if ((sVar4 == 5) && (iVar2 = bcmp(__s1,"match",5), iVar2 == 0)) {
            requireUInt32(this,(PragmaExpressionSyntax *)pSVar1[2].parent);
          }
          else if (sVar4 != 0) {
            SVar10 = Token::range((Token *)(pSVar1 + 1));
            pDVar5 = addDiag(this,(DiagCode)0x2e0004,SVar10);
            arg = Token::valueText(&local_48);
            pDVar5 = Diagnostic::operator<<(pDVar5,arg);
            goto LAB_001ce1c1;
          }
        }
        else {
          SVar10 = slang::syntax::SyntaxNode::sourceRange(pSVar1);
          pDVar5 = addDiag(this,(DiagCode)0x270004,SVar10);
          sVar9 = Token::valueText(&local_48);
LAB_001ce1c1:
          Diagnostic::operator<<(pDVar5,sVar9);
        }
        lVar8 = lVar8 + 0x30;
        uVar7 = uVar7 - 1;
        if (uVar7 == 0) {
          return;
        }
      } while( true );
    }
    SVar10 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar5 = addDiag(this,(DiagCode)0x270004,SVar10);
  sVar9 = Token::valueText(&local_48);
  Diagnostic::operator<<(pDVar5,sVar9);
  return;
}

Assistant:

void Preprocessor::handleProtectLicense(Token keyword, const PragmaExpressionSyntax* args,
                                        SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "library"sv || name == "entry"sv || name == "feature"sv || name == "exit"sv) {
            if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
                nvp.value->as<SimplePragmaExpressionSyntax>().value.kind !=
                    TokenKind::StringLiteral) {
                addDiag(diag::ExpectedProtectArg, nvp.value->sourceRange()) << name;
            }
        }
        else if (name == "match"sv) {
            requireUInt32(*nvp.value);
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}